

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O2

vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderGeneric::BlocksInfo
          (vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
           *__return_storage_ptr__,SscReaderGeneric *this,VariableStruct *variable,size_t step)

{
  pointer pvVar1;
  pointer pBVar2;
  pointer pBVar3;
  size_t sVar4;
  __type _Var5;
  size_t sVar6;
  long lVar7;
  BlockInfo *v;
  pointer __lhs;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 0;
  sVar6 = 0;
  while( true ) {
    pvVar1 = (this->m_GlobalWritePattern).
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_GlobalWritePattern).
                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= lVar7)
    break;
    pBVar2 = *(pointer *)
              ((long)&pvVar1[lVar7].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (__lhs = pvVar1[lVar7].
                 super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pBVar2; __lhs = __lhs + 1) {
      _Var5 = std::operator==(&__lhs->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (variable + 8));
      if (_Var5) {
        std::
        vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
        ::emplace_back<>(__return_storage_ptr__);
        pBVar3 = (__return_storage_ptr__->
                 super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pBVar3[-1].Start,&__lhs->start);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pBVar3[-1].Count,&__lhs->count);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&pBVar3[-1].Shape,&__lhs->shape);
        sVar4 = (this->super_SscReaderBase).m_CurrentStep;
        pBVar3[-1].Step = sVar4;
        pBVar3[-1].StepsStart = sVar4;
        pBVar3[-1].StepsCount = 1;
        pBVar3[-1].WriterID = (int)lVar7;
        pBVar3[-1].BlockID = sVar6;
        if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
          pBVar3[-1].IsReverseDims = true;
        }
        sVar6 = sVar6 + 1;
      }
    }
    lVar7 = lVar7 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VariableStruct::BPInfo> SscReaderGeneric::BlocksInfo(const VariableStruct &variable,
                                                                 const size_t step) const
{
    std::vector<VariableStruct::BPInfo> ret;
    size_t blockID = 0;
    for (int i = 0; i < static_cast<int>(m_GlobalWritePattern.size()); ++i)
    {
        for (auto &v : m_GlobalWritePattern[i])
        {
            if (v.name == variable.m_Name)
            {
                ret.emplace_back();
                auto &b = ret.back();
                b.Start = v.start;
                b.Count = v.count;
                b.Shape = v.shape;
                b.Step = m_CurrentStep;
                b.StepsStart = m_CurrentStep;
                b.StepsCount = 1;
                b.WriterID = i;
                b.BlockID = blockID;
                if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    b.IsReverseDims = true;
                }
                ++blockID;
            }
        }
    }
    return ret;
}